

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O2

void crnlib::MatchFinder_CheckLimits(CMatchFinder *p)

{
  uint subValue;
  
  if (p->pos == 0xffffffff) {
    subValue = -p->historySize - 2 & 0xfffffc00;
    MatchFinder_Normalize3(subValue,p->hash,p->numSons + p->hashSizeSum);
    MatchFinder_ReduceOffsets(p,subValue);
  }
  if ((p->streamEndWasReached == 0) && (p->keepSizeAfter == p->streamPos - p->pos)) {
    if (p->bufferBase + ((ulong)p->blockSize - (long)p->buffer) <= (Byte *)(ulong)p->keepSizeAfter)
    {
      MatchFinder_MoveBlock(p);
    }
    MatchFinder_ReadBlock(p);
  }
  if (p->cyclicBufferPos == p->cyclicBufferSize) {
    p->cyclicBufferPos = 0;
  }
  MatchFinder_SetLimits(p);
  return;
}

Assistant:

static void MatchFinder_CheckLimits(CMatchFinder* p) {
  if (p->pos == kMaxValForNormalize)
    MatchFinder_Normalize(p);
  if (!p->streamEndWasReached && p->keepSizeAfter == p->streamPos - p->pos)
    MatchFinder_CheckAndMoveAndRead(p);
  if (p->cyclicBufferPos == p->cyclicBufferSize)
    p->cyclicBufferPos = 0;
  MatchFinder_SetLimits(p);
}